

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

cio_error cio_timer_expires_from_now
                    (cio_timer *timer,uint64_t timeout_ns,cio_timer_handler_t handler,
                    void *handler_context)

{
  int iVar1;
  int *piVar2;
  undefined1 local_50 [4];
  int ret;
  itimerspec timeout;
  void *handler_context_local;
  cio_timer_handler_t handler_local;
  uint64_t timeout_ns_local;
  cio_timer *timer_local;
  
  timeout.it_value.tv_nsec = (__syscall_slong_t)handler_context;
  convert_timeoutns_to_itimerspec((itimerspec *)local_50,timeout_ns);
  timer->handler = handler;
  timer->handler_context = (void *)timeout.it_value.tv_nsec;
  (timer->impl).ev.context = timer;
  iVar1 = timerfd_settime((timer->impl).ev.fd,0,(itimerspec *)local_50,(itimerspec *)0x0);
  if (iVar1 == 0) {
    timer_read(timer,CIO_EPOLL_SUCCESS);
    timer_local._4_4_ = CIO_SUCCESS;
  }
  else {
    piVar2 = __errno_location();
    timer_local._4_4_ = -*piVar2;
  }
  return timer_local._4_4_;
}

Assistant:

enum cio_error cio_timer_expires_from_now(struct cio_timer *timer, uint64_t timeout_ns, cio_timer_handler_t handler, void *handler_context)
{
	struct itimerspec timeout = convert_timeoutns_to_itimerspec(timeout_ns);

	timer->handler = handler;
	timer->handler_context = handler_context;
	timer->impl.ev.context = timer;

	int ret = timerfd_settime(timer->impl.ev.fd, 0, &timeout, NULL);
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	timer_read(timer, CIO_EPOLL_SUCCESS);
	return CIO_SUCCESS;
}